

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O0

void dotty(lua_State *L)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  char *oldprogname;
  int status;
  lua_State *L_local;
  
  pcVar1 = progname;
  progname = (char *)0x0;
  while (oldprogname._4_4_ = loadline(L), oldprogname._4_4_ != -1) {
    if (oldprogname._4_4_ == 0) {
      oldprogname._4_4_ = docall(L,0,0);
    }
    report(L,oldprogname._4_4_);
    if ((oldprogname._4_4_ == 0) && (iVar2 = lua_gettop(L), 0 < iVar2)) {
      lua_getfield(L,-0x2712,"print");
      lua_insert(L,1);
      iVar2 = lua_gettop(L);
      iVar2 = lua_pcall(L,iVar2 + -1,0,0);
      if (iVar2 != 0) {
        pcVar3 = lua_tolstring(L,-1,(size_t *)0x0);
        pcVar3 = lua_pushfstring(L,"error calling \'print\' (%s)",pcVar3);
        l_message(pcVar3);
      }
    }
  }
  lua_settop(L,0);
  fputs("\n",_stdout);
  fflush(_stdout);
  progname = pcVar1;
  return;
}

Assistant:

static void dotty(lua_State *L)
{
  int status;
  const char *oldprogname = progname;
  progname = NULL;
  while ((status = loadline(L)) != -1) {
    if (status == LUA_OK) status = docall(L, 0, 0);
    report(L, status);
    if (status == LUA_OK && lua_gettop(L) > 0) {  /* any result to print? */
      lua_getglobal(L, "print");
      lua_insert(L, 1);
      if (lua_pcall(L, lua_gettop(L)-1, 0, 0) != 0)
	l_message(lua_pushfstring(L, "error calling " LUA_QL("print") " (%s)",
				  lua_tostring(L, -1)));
    }
  }
  lua_settop(L, 0);  /* clear stack */
  fputs("\n", stdout);
  fflush(stdout);
  progname = oldprogname;
}